

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.h
# Opt level: O2

void __thiscall DSDcc::DSDDstar::DStarHeader::~DStarHeader(DStarHeader *this)

{
  std::__cxx11::string::~string((string *)&this->m_mySign);
  std::__cxx11::string::~string((string *)&this->m_yourSign);
  std::__cxx11::string::~string((string *)&this->m_rpt2);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

void clear()
       {
           m_rpt1.clear();
           m_rpt2.clear();
           m_yourSign.clear();
           m_mySign.clear();
           m_rpt1FromHD = false;
           m_rpt2FromHD = false;
           m_yourSignFromHD = false;
           m_mySignFromHD = false;
       }